

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O1

size_t __thiscall
gmlc::containers::
SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>::
size(SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
     *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  int iVar5;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_pullLock);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar5 == 0) {
    puVar1 = (this->pushElements).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar2 = (this->pullElements).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar3 = (this->pullElements).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->pushElements).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_pullLock);
    return ((long)puVar1 - (long)puVar4 >> 3) + ((long)puVar2 - (long)puVar3 >> 3);
  }
  std::__throw_system_error(iVar5);
}

Assistant:

size_t size() const
        {
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
            return pullElements.size() + pushElements.size();
        }